

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executable.cpp
# Opt level: O0

addr_type __thiscall Executable::detectAddrType(Executable *this,offset_t offset,addr_type hintType)

{
  uint uVar1;
  addr_type local_24;
  addr_type hintType_local;
  offset_t offset_local;
  Executable *this_local;
  
  if (hintType == RAW) {
    uVar1 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x15])(this,offset,1);
    this_local._4_4_ = hintType;
    if ((uVar1 & 1) == 0) {
      this_local._4_4_ = NOT_ADDR;
    }
  }
  else {
    local_24 = hintType;
    if (hintType == NOT_ADDR) {
      local_24 = RVA;
    }
    uVar1 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x15])
                      (this,offset,(ulong)local_24);
    if ((uVar1 & 1) == 0) {
      if (local_24 == RVA) {
        local_24 = VA;
      }
      else {
        local_24 = RVA;
      }
    }
    uVar1 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x15])
                      (this,offset,(ulong)local_24);
    if ((uVar1 & 1) == 0) {
      this_local._4_4_ = NOT_ADDR;
    }
    else {
      this_local._4_4_ = local_24;
    }
  }
  return this_local._4_4_;
}

Assistant:

Executable::addr_type Executable::detectAddrType(offset_t offset, Executable::addr_type hintType)
{
    if (hintType == Executable::RAW) {
        if (this->isValidAddr(offset, hintType) == false) {
            return Executable::NOT_ADDR;
        } else return hintType; // it is RAW
    }

    if (hintType == Executable::NOT_ADDR) {
        hintType = Executable::RVA; // check RVA by default
    }
    if (this->isValidAddr(offset, hintType) == false) {
        if (hintType == Executable::RVA) {
            hintType = Executable::VA; // if not RVA, try VA
        } else {
            hintType = Executable::RVA; // if not VA, try RVA
        }
    }
    if (this->isValidAddr(offset, hintType) == false) {
        return Executable::NOT_ADDR; //every attempt failed! it's invalid!
    }
    return hintType;
}